

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O2

void duckdb::ParquetCrypto::AddKey(ClientContext *context,FunctionParameters *parameters)

{
  const_reference pvVar1;
  string *key_name;
  string *key;
  ParquetKeys *this;
  InvalidInputException *this_00;
  allocator local_71;
  string local_70;
  string decoded_key;
  
  pvVar1 = vector<duckdb::Value,_true>::get<true>(&parameters->values,0);
  key_name = StringValue::Get_abi_cxx11_(pvVar1);
  pvVar1 = vector<duckdb::Value,_true>::get<true>(&parameters->values,1);
  key = StringValue::Get_abi_cxx11_(pvVar1);
  this = ParquetKeys::Get(context);
  if ((key->_M_string_length < 0x21) && ((0x101010000U >> (key->_M_string_length & 0x3f) & 1) != 0))
  {
    ParquetKeys::AddKey(this,key_name,key);
    return;
  }
  decoded_key._M_dataplus._M_p = (pointer)&decoded_key.field_2;
  decoded_key._M_string_length = 0;
  decoded_key.field_2._M_local_buf[0] = '\0';
  Base64Decode(&local_70,key);
  ::std::__cxx11::string::operator=((string *)&decoded_key,(string *)&local_70);
  ::std::__cxx11::string::~string((string *)&local_70);
  if ((decoded_key._M_string_length < 0x21) &&
     ((0x101010000U >> (decoded_key._M_string_length & 0x3f) & 1) != 0)) {
    ParquetKeys::AddKey(this,key_name,&decoded_key);
    ::std::__cxx11::string::~string((string *)&decoded_key);
    return;
  }
  this_00 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_70,
             "Invalid AES key. Must have a length of 128, 192, or 256 bits (16, 24, or 32 bytes)",
             &local_71);
  InvalidInputException::InvalidInputException(this_00,&local_70);
  __cxa_throw(this_00,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void ParquetCrypto::AddKey(ClientContext &context, const FunctionParameters &parameters) {
	const auto &key_name = StringValue::Get(parameters.values[0]);
	const auto &key = StringValue::Get(parameters.values[1]);

	auto &keys = ParquetKeys::Get(context);
	if (ValidKey(key)) {
		keys.AddKey(key_name, key);
	} else {
		string decoded_key;
		try {
			decoded_key = Base64Decode(key);
		} catch (const ConversionException &e) {
			throw InvalidInputException("Invalid AES key. Not a plain AES key NOR a base64 encoded string");
		}
		if (!ValidKey(decoded_key)) {
			throw InvalidInputException(
			    "Invalid AES key. Must have a length of 128, 192, or 256 bits (16, 24, or 32 bytes)");
		}
		keys.AddKey(key_name, decoded_key);
	}
}